

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O2

string * __thiscall
gl4cts::ShaderSubroutine::NegativeTest4::getShaderBody_abi_cxx11_
          (string *__return_storage_ptr__,NegativeTest4 *this,_shader_stage *shader_stage,
          uint *n_subroutine_types,_test_case *test_case)

{
  ostream *poVar1;
  TestError *this_00;
  uint n_subroutine_type;
  ulong uVar2;
  char *pcVar3;
  uint n_subroutine_type_1;
  stringstream result_sstream;
  ostream local_1a8;
  
  std::__cxx11::stringstream::stringstream((stringstream *)&result_sstream);
  std::operator<<(&local_1a8,"#version 400\n\n#extension GL_ARB_shader_subroutine : require\n\n");
  if (*shader_stage - SHADER_STAGE_TESSELLATION_CONTROL < 3) {
    std::operator<<(&local_1a8,
                    &DAT_016a9600 +
                    *(int *)(&DAT_016a9600 +
                            (ulong)(*shader_stage - SHADER_STAGE_TESSELLATION_CONTROL) * 4));
  }
  pcVar3 = "(inout vec3 argument);\n";
  for (uVar2 = 0; uVar2 < *n_subroutine_types - 1; uVar2 = uVar2 + 1) {
    poVar1 = std::operator<<(&local_1a8,"subroutine void subroutineType");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<(poVar1,"(inout vec3 argument);\n");
  }
  if (*test_case == TEST_CASE_FIRST) {
    poVar1 = std::operator<<(&local_1a8,"subroutine int subroutineType");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  }
  else {
    if (*test_case != TEST_CASE_INCOMPATIBLE_ARGUMENT_LIST) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Unrecognized test case",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                 ,0x2e3b);
      goto LAB_00a2343c;
    }
    poVar1 = std::operator<<(&local_1a8,"subroutine void subroutineType");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    pcVar3 = "(inout vec3 argument, out vec4 argument2);\n";
  }
  std::operator<<(poVar1,pcVar3);
  std::operator<<(&local_1a8,"subroutine(");
  for (uVar2 = 0; uVar2 < *n_subroutine_types; uVar2 = uVar2 + 1) {
    poVar1 = std::operator<<(&local_1a8,"subroutineType");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    if (uVar2 != *n_subroutine_types - 1) {
      std::operator<<(&local_1a8,", ");
    }
  }
  std::operator<<(&local_1a8,
                  ") void function(inout vec3 argument)\n{\n    argument = vec3(1, 2, 3);\n}\n\n");
  if ((ulong)*shader_stage < 5) {
    std::operator<<(&local_1a8,&DAT_016a960c + *(int *)(&DAT_016a960c + (ulong)*shader_stage * 4));
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)&result_sstream);
    return __return_storage_ptr__;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Unrecognized shader stage",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
             ,0x2e89);
LAB_00a2343c:
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

std::string NegativeTest4::getShaderBody(const Utils::_shader_stage& shader_stage,
										 const unsigned int& n_subroutine_types, const _test_case& test_case) const
{
	std::stringstream result_sstream;

	/* Form the pre-amble */
	result_sstream << "#version 400\n"
					  "\n"
					  "#extension GL_ARB_shader_subroutine : require\n"
					  "\n";

	/* Inject stage-specific code */
	switch (shader_stage)
	{
	case Utils::SHADER_STAGE_GEOMETRY:
	{
		result_sstream << "layout (points) in;\n"
						  "layout (points, max_vertices = 1) out;\n"
						  "\n";

		break;
	}

	case Utils::SHADER_STAGE_TESSELLATION_CONTROL:
	{
		result_sstream << "layout (vertices = 4) out;\n"
						  "\n";

		break;
	}

	case Utils::SHADER_STAGE_TESSELLATION_EVALUATION:
	{
		result_sstream << "layout (quads) in;\n"
						  "\n";

		break;
	}

	default:
		break;
	} /* switch (shader_stage) */

	/* Insert subroutine type declarations */
	for (unsigned int n_subroutine_type = 0; n_subroutine_type < n_subroutine_types - 1; ++n_subroutine_type)
	{
		result_sstream << "subroutine void subroutineType" << n_subroutine_type << "(inout vec3 argument);\n";
	} /* for (all subroutine types) */

	switch (test_case)
	{
	case TEST_CASE_INCOMPATIBLE_ARGUMENT_LIST:
	{
		result_sstream << "subroutine void subroutineType" << (n_subroutine_types - 1)
					   << "(inout vec3 argument, out vec4 argument2);\n";

		break;
	}

	case TEST_CASE_INCOMPATIBLE_RETURN_TYPE:
	{
		result_sstream << "subroutine int subroutineType" << (n_subroutine_types - 1) << "(inout vec3 argument);\n";

		break;
	}

	default:
	{
		TCU_FAIL("Unrecognized test case");
	}
	} /* switch (test_case) */

	/* Insert subroutine declarations */
	result_sstream << "subroutine(";

	for (unsigned int n_subroutine_type = 0; n_subroutine_type < n_subroutine_types; ++n_subroutine_type)
	{
		result_sstream << "subroutineType" << n_subroutine_type;

		if (n_subroutine_type != (n_subroutine_types - 1))
		{
			result_sstream << ", ";
		}
	} /* for (all subroutine types) */

	result_sstream << ") void function(inout vec3 argument)\n"
					  "{\n"
					  "    argument = vec3(1, 2, 3);\n"
					  "}\n"
					  "\n";

	/* Insert remaining required stage-specific bits */
	switch (shader_stage)
	{
	case Utils::SHADER_STAGE_FRAGMENT:
	{
		result_sstream << "out vec4 result;\n"
						  "\n"
						  "void main()\n"
						  "{\n"
						  "    result = vec4(1, 2, 3, 4);\n"
						  "}\n";

		break;
	}

	case Utils::SHADER_STAGE_GEOMETRY:
	{
		result_sstream << "void main()\n"
						  "{\n"
						  "    gl_Position = vec4(1, 2, 3, 4);\n"
						  "    EmitVertex();\n"
						  "}\n";

		break;
	}

	case Utils::SHADER_STAGE_TESSELLATION_CONTROL:
	{
		result_sstream << "void main()\n"
						  "{\n"
						  "    gl_TessLevelInner[0]                = 1;\n"
						  "    gl_TessLevelInner[1]                = 1;\n"
						  "    gl_TessLevelOuter[0]                = 1;\n"
						  "    gl_TessLevelOuter[1]                = 1;\n"
						  "    gl_TessLevelOuter[2]                = 1;\n"
						  "    gl_TessLevelOuter[3]                = 1;\n"
						  "    gl_out[gl_InvocationID].gl_Position = vec4(2, 3, 4, 5);\n"
						  "}\n";

		break;
	}

	case Utils::SHADER_STAGE_TESSELLATION_EVALUATION:
	case Utils::SHADER_STAGE_VERTEX:
	{
		result_sstream << "void main()\n"
						  "{\n"
						  "    gl_Position = vec4(1, 2, 3, 4);\n"
						  "}\n";

		break;
	}

	default:
	{
		TCU_FAIL("Unrecognized shader stage");
	}
	} /* switch (shader_stage) */

	return result_sstream.str();
}